

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void __thiscall
EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<4,_4>,_int,_HashFn> *this)

{
  allocator_type local_1b;
  key_equal local_1a;
  hasher local_19;
  key_type local_18;
  key_type local_14;
  
  google::
  dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::dense_hash_map(&this->
                    super_dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                   ,0,&local_19,&local_1a,&local_1b);
  local_14.i_ = -1;
  google::
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::set_empty_key((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                   *)this,&local_14);
  local_18.i_ = -2;
  google::
  dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::set_deleted_key((dense_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                     *)this,&local_18);
  return;
}

Assistant:

EasyUseDenseHashMap() {
    this->set_empty_key(-1);
    this->set_deleted_key(-2);
  }